

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O3

XSElementDeclaration * __thiscall
xercesc_4_0::XSObjectFactory::addOrFind
          (XSObjectFactory *this,SchemaElementDecl *elemDecl,XSModel *xsModel,
          XSComplexTypeDefinition *enclosingTypeDef)

{
  PSVIScope PVar1;
  XMLSize_t maxElems;
  int iVar2;
  int iVar3;
  XSElementDeclaration *this_00;
  IdentityConstraint *ic;
  XSIDCDefinition *toAdd;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XSAnnotation *annot;
  XSComplexTypeDefinition *pXVar4;
  XSObjectFactory *this_01;
  SCOPE elemScope;
  XMLSize_t i;
  XMLSize_t getAt;
  XSNamedMap<xercesc_4_0::XSIDCDefinition> *local_58;
  XSSimpleTypeDefinition *local_50;
  XSElementDeclaration *local_48;
  
  this_00 = (XSElementDeclaration *)XSModel::getXSObject(xsModel,elemDecl);
  if (this_00 == (XSElementDeclaration *)0x0) {
    if (elemDecl->fSubstitutionGroupElem == (SchemaElementDecl *)0x0) {
      local_48 = (XSElementDeclaration *)0x0;
    }
    else {
      local_48 = addOrFind(this,elemDecl->fSubstitutionGroupElem,xsModel,
                           (XSComplexTypeDefinition *)0x0);
    }
    if ((elemDecl->fComplexTypeInfo == (ComplexTypeInfo *)0x0) &&
       (elemDecl->fDatatypeValidator != (DatatypeValidator *)0x0)) {
      local_50 = addOrFind(this,elemDecl->fDatatypeValidator,xsModel,false);
    }
    else {
      local_50 = (XSSimpleTypeDefinition *)0x0;
    }
    if ((elemDecl->fIdentityConstraints == (RefVectorOf<xercesc_4_0::IdentityConstraint> *)0x0) ||
       (maxElems = (elemDecl->fIdentityConstraints->
                   super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>).fCurCount, maxElems == 0)
       ) {
      local_58 = (XSNamedMap<xercesc_4_0::XSIDCDefinition> *)0x0;
    }
    else {
      local_58 = (XSNamedMap<xercesc_4_0::XSIDCDefinition> *)
                 XMemory::operator_new(0x20,this->fMemoryManager);
      XSNamedMap<xercesc_4_0::XSIDCDefinition>::XSNamedMap
                (local_58,maxElems,0x1d,xsModel->fURIStringPool,false,this->fMemoryManager);
      getAt = 0;
      do {
        if (&elemDecl->fIdentityConstraints->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>
            == (BaseRefVectorOf<xercesc_4_0::IdentityConstraint> *)0x0) {
          ic = (IdentityConstraint *)0x0;
        }
        else {
          ic = BaseRefVectorOf<xercesc_4_0::IdentityConstraint>::elementAt
                         (&elemDecl->fIdentityConstraints->
                           super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>,getAt);
        }
        toAdd = addOrFind(this,ic,xsModel);
        if (toAdd != (XSIDCDefinition *)0x0) {
          iVar2 = (*(toAdd->super_XSObject)._vptr_XSObject[2])(toAdd);
          iVar3 = (*(toAdd->super_XSObject)._vptr_XSObject[3])(toAdd);
          XSNamedMap<xercesc_4_0::XSIDCDefinition>::addElement
                    (local_58,toAdd,(XMLCh *)CONCAT44(extraout_var,iVar2),
                     (XMLCh *)CONCAT44(extraout_var_00,iVar3));
        }
        getAt = getAt + 1;
      } while (maxElems != getAt);
    }
    PVar1 = elemDecl->fPSVIScope;
    this_01 = (XSObjectFactory *)0x60;
    this_00 = (XSElementDeclaration *)XMemory::operator_new(0x60,this->fMemoryManager);
    annot = getAnnotationFromModel(this_01,xsModel,elemDecl);
    elemScope = (SCOPE)(PVar1 == SCP_GLOBAL);
    if (PVar1 == SCP_LOCAL) {
      elemScope = SCOPE_LOCAL;
    }
    XSElementDeclaration::XSElementDeclaration
              (this_00,elemDecl,&local_50->super_XSTypeDefinition,local_48,annot,local_58,xsModel,
               elemScope,enclosingTypeDef,this->fMemoryManager);
    putObjectInMap(this,elemDecl,(XSObject *)this_00);
    if (elemDecl->fComplexTypeInfo == (ComplexTypeInfo *)0x0) {
      if (local_50 != (XSSimpleTypeDefinition *)0x0) {
        return this_00;
      }
      pXVar4 = (XSComplexTypeDefinition *)
               XSModel::getTypeDefinition(xsModel,L"anyType",L"http://www.w3.org/2001/XMLSchema");
    }
    else {
      pXVar4 = addOrFind(this,elemDecl->fComplexTypeInfo,xsModel);
    }
    this_00->fTypeDefinition = &pXVar4->super_XSTypeDefinition;
  }
  else if ((enclosingTypeDef != (XSComplexTypeDefinition *)0x0) &&
          (this_00->fEnclosingTypeDefinition == (XSComplexTypeDefinition *)0x0)) {
    this_00->fEnclosingTypeDefinition = enclosingTypeDef;
  }
  return this_00;
}

Assistant:

XSElementDeclaration*
XSObjectFactory::addOrFind(SchemaElementDecl* const elemDecl,
                           XSModel* const xsModel,
                           XSComplexTypeDefinition* const enclosingTypeDef)
{
    XSElementDeclaration* xsObj = (XSElementDeclaration*) xsModel->getXSObject(elemDecl);
    if (xsObj)
    {
        if (!xsObj->getEnclosingCTDefinition() && enclosingTypeDef)
            xsObj->setEnclosingCTDefinition(enclosingTypeDef);
    }
    else
    {
        XSElementDeclaration*        xsSubElem = 0;
        XSTypeDefinition*            xsType = 0;
        XSNamedMap<XSIDCDefinition>* icMap = 0;

        if (elemDecl->getSubstitutionGroupElem())
            xsSubElem = addOrFind(elemDecl->getSubstitutionGroupElem(), xsModel);

        // defer checking for complexTypeInfo until later as it could
        // eventually need this elemement
        // but don't check simple type unless no complexTypeInfo present
        if (!elemDecl->getComplexTypeInfo() && elemDecl->getDatatypeValidator())
            xsType = addOrFind(elemDecl->getDatatypeValidator(), xsModel);

        XMLSize_t count = elemDecl->getIdentityConstraintCount();
        if (count)
        {
            //REVISIT: size of hash table....
            icMap = new (fMemoryManager) XSNamedMap<XSIDCDefinition>
            (
                count
                , 29
                , xsModel->getURIStringPool()
                , false
                , fMemoryManager
            );

            for (XMLSize_t i = 0; i < count; i++)
            {
                XSIDCDefinition* icDef = addOrFind
                (
                    elemDecl->getIdentityConstraintAt(i)
                    , xsModel
                );
                if (icDef)
                {
                    icMap->addElement
                    (
                        icDef
                        , icDef->getName()
                        , icDef->getNamespace()
                    );
                }
            }
        }

        XSConstants::SCOPE elemScope = XSConstants::SCOPE_ABSENT;
        if (elemDecl->getPSVIScope() == PSVIDefs::SCP_LOCAL)
            elemScope = XSConstants::SCOPE_LOCAL;
        else if (elemDecl->getPSVIScope() == PSVIDefs::SCP_GLOBAL)
            elemScope = XSConstants::SCOPE_GLOBAL;

        xsObj = new (fMemoryManager) XSElementDeclaration
        (
            elemDecl
            , xsType
            , xsSubElem
            , getAnnotationFromModel(xsModel, elemDecl)
            , icMap
            , xsModel
            , elemScope
            , enclosingTypeDef
            , fMemoryManager
        );
        putObjectInMap(elemDecl, xsObj);

        if (elemDecl->getComplexTypeInfo())
        {
            xsType = addOrFind(elemDecl->getComplexTypeInfo(), xsModel);
            xsObj->setTypeDefinition(xsType);
        }
        else if (!xsType)
        {
            xsType = xsModel->getTypeDefinition
            (
                SchemaSymbols::fgATTVAL_ANYTYPE
                , SchemaSymbols::fgURI_SCHEMAFORSCHEMA
            );
            xsObj->setTypeDefinition(xsType);
        }
    }

    return xsObj;
}